

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord2.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::DATA_TYPE::PointRecord2::Encode(KDataStream *__return_storage_ptr__,PointRecord2 *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  PointRecord1::Encode(&this->super_PointRecord1,__return_storage_ptr__);
  (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Vel,__return_storage_ptr__);
  KDataStream::Write<unsigned_int>(__return_storage_ptr__,this->m_ui32Padding);
  return __return_storage_ptr__;
}

Assistant:

KDataStream PointRecord2::Encode() const
{
    KDataStream stream;

    PointRecord2::Encode( stream );

    return stream;
}